

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

int Gia_SweeperProbeUpdate(Gia_Man_t *p,int ProbeId,int iLitNew)

{
  int iVar1;
  long lVar2;
  
  if ((-1 < ProbeId) && (lVar2 = *(long *)((long)p->pData + 0x10), ProbeId < *(int *)(lVar2 + 4))) {
    lVar2 = *(long *)(lVar2 + 8);
    iVar1 = *(int *)(lVar2 + (ulong)(uint)ProbeId * 4);
    if (-1 < iVar1) {
      *(int *)(lVar2 + (ulong)(uint)ProbeId * 4) = iLitNew;
      return iVar1;
    }
    __assert_fail("iLit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x10f,"int Gia_SweeperProbeUpdate(Gia_Man_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_SweeperProbeUpdate( Gia_Man_t * p, int ProbeId, int iLitNew )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    int iLit = Vec_IntEntry(pSwp->vProbes, ProbeId);
    assert( iLit >= 0 );
    Vec_IntWriteEntry(pSwp->vProbes, ProbeId, iLitNew);
    return iLit;
}